

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::CloudMediumProvider::Density(CloudMediumProvider *this,Point3f *p,SampledWavelengths *lambda)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  Float FVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar10 [64];
  undefined1 extraout_var [60];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Tuple3<pbrt::Point3,_float> TVar15;
  float local_100;
  float local_fc;
  Tuple3<pbrt::Point3,_float> local_f8;
  float local_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  float fStack_c0;
  float fStack_bc;
  Tuple3<pbrt::Point3,_float> local_b8;
  Tuple3<pbrt::Point3,_float> local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  Float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  Float local_68;
  undefined1 local_58 [16];
  SampledSpectrum local_40;
  
  fStack_c0 = 0.0;
  fStack_bc = 0.0;
  TVar15 = (Tuple3<pbrt::Point3,_float>)
           Tuple3<pbrt::Point3,float>::operator*((Tuple3<pbrt::Point3,float> *)p,this->extent * 5.0)
  ;
  local_fc = 0.0;
  if (0.0 < this->wispiness) {
    fVar12 = this->wispiness * 0.05;
    fVar8 = 10.0;
    iVar4 = 2;
    while (local_100 = TVar15.z, local_c8 = TVar15._0_8_, uVar2 = local_c8, bVar5 = iVar4 != 0,
          iVar4 = iVar4 + -1, bVar5) {
      local_e8 = ZEXT416((uint)fVar8);
      fVar1 = fVar8 * local_100;
      local_58 = ZEXT416((uint)fVar12);
      local_c8._0_4_ = TVar15.x;
      local_c8._4_4_ = TVar15.y;
      local_d8._0_4_ = fVar8 * (float)local_c8;
      local_d8._4_4_ = fVar8 * local_c8._4_4_;
      fStack_d0 = fVar8 * fStack_c0;
      fStack_cc = fVar8 * fStack_bc;
      local_f8._0_8_ = vmovlps_avx(_local_d8);
      local_f8.z = fVar1;
      local_c8 = uVar2;
      local_68 = Noise((Point3f *)&local_f8);
      local_f8.z = fVar1 + 0.0;
      local_88._0_4_ = (float)local_d8._0_4_ + 0.01;
      local_88._4_4_ = (float)local_d8._4_4_ + 0.0;
      local_88._8_4_ = fStack_d0 + 0.0;
      local_88._12_4_ = fStack_cc + 0.0;
      local_f8._0_8_ = vmovlps_avx(local_88);
      local_ec = local_f8.z;
      local_78 = Noise((Point3f *)&local_f8);
      auVar6 = vmovshdup_avx(_local_d8);
      local_98 = ZEXT416((uint)(local_d8._0_4_ + 0.0));
      auVar6 = vinsertps_avx(local_98,ZEXT416((uint)(auVar6._0_4_ + 0.01)),0x10);
      local_a8._0_8_ = vmovlps_avx(auVar6);
      local_a8.z = local_ec;
      uStack_74 = extraout_XMM0_Db;
      uStack_70 = extraout_XMM0_Dc;
      uStack_6c = extraout_XMM0_Dd;
      local_d8._0_4_ = Noise((Point3f *)&local_a8);
      local_d8._4_4_ = extraout_XMM0_Db_00;
      fStack_d0 = (float)extraout_XMM0_Dc_00;
      fStack_cc = (float)extraout_XMM0_Dd_00;
      local_b8.z = fVar1 + 0.01;
      auVar6 = vblendps_avx(local_98,local_88,2);
      local_b8._0_8_ = vmovlps_avx(auVar6);
      FVar9 = Noise((Point3f *)&local_b8);
      auVar3._4_4_ = uStack_74;
      auVar3._0_4_ = local_78;
      auVar3._8_4_ = uStack_70;
      auVar3._12_4_ = uStack_6c;
      auVar6 = vinsertps_avx(auVar3,ZEXT416((uint)local_d8._0_4_),0x10);
      auVar13._4_4_ = local_68;
      auVar13._0_4_ = local_68;
      auVar13._8_4_ = local_68;
      auVar13._12_4_ = local_68;
      auVar6 = vsubps_avx(auVar6,auVar13);
      fVar12 = (float)local_58._0_4_ * 0.5;
      auVar11._0_4_ = (float)local_58._0_4_ * auVar6._0_4_;
      auVar11._4_4_ = (float)local_58._0_4_ * auVar6._4_4_;
      auVar11._8_4_ = (float)local_58._0_4_ * auVar6._8_4_;
      auVar11._12_4_ = (float)local_58._0_4_ * auVar6._12_4_;
      auVar14._8_4_ = 0x3c23d70a;
      auVar14._0_8_ = 0x3c23d70a3c23d70a;
      auVar14._12_4_ = 0x3c23d70a;
      auVar6 = vdivps_avx512vl(auVar11,auVar14);
      fStack_c0 = fStack_c0 + auVar6._8_4_;
      fStack_bc = fStack_bc + auVar6._12_4_;
      fVar8 = (float)local_e8._0_4_ * 2.01;
      TVar15.z = local_100 + ((float)local_58._0_4_ * (FVar9 - local_68)) / 0.01;
      TVar15.x = (float)local_c8 + auVar6._0_4_;
      TVar15.y = local_c8._4_4_ + auVar6._4_4_;
    }
  }
  auVar10 = ZEXT464(0x3f800000);
  fVar12 = 0.5;
  iVar4 = 5;
  while (local_100 = TVar15.z, local_c8 = TVar15._0_8_, uVar2 = local_c8, bVar5 = iVar4 != 0,
        iVar4 = iVar4 + -1, bVar5) {
    local_e8._0_4_ = auVar10._0_4_;
    local_f8.z = (float)local_e8._0_4_ * local_100;
    local_c8._0_4_ = TVar15.x;
    local_c8._4_4_ = TVar15.y;
    auVar6._0_4_ = (float)local_e8._0_4_ * (float)local_c8;
    auVar6._4_4_ = (float)local_e8._0_4_ * local_c8._4_4_;
    auVar6._8_4_ = (float)local_e8._0_4_ * fStack_c0;
    auVar6._12_4_ = (float)local_e8._0_4_ * fStack_bc;
    local_f8._0_8_ = vmovlps_avx(auVar6);
    local_e8 = auVar10._0_16_;
    local_c8 = uVar2;
    auVar10._0_4_ = Noise((Point3f *)&local_f8);
    TVar15.z = local_100;
    TVar15.x = (float)local_c8;
    TVar15.y = local_c8._4_4_;
    auVar10._4_60_ = extraout_var;
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)local_fc),ZEXT416((uint)fVar12),auVar10._0_16_);
    fVar12 = fVar12 * 0.5;
    auVar10 = ZEXT464((uint)((float)local_e8._0_4_ * 2.01));
    local_fc = auVar6._0_4_;
  }
  fVar12 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar14 = ZEXT816(0) << 0x40;
  auVar7 = ZEXT416((uint)((1.0 - fVar12) * 4.5 * this->density * local_fc));
  auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar7);
  uVar2 = vcmpss_avx512f(auVar7,auVar14,1);
  auVar7._4_12_ = auVar6._4_12_;
  auVar7._0_4_ = (uint)!(bool)((byte)uVar2 & 1) * auVar6._0_4_;
  auVar6 = vmaxss_avx(ZEXT416((uint)(0.5 - fVar12)),auVar14);
  auVar7 = vfmadd132ss_fma(auVar6,auVar7,ZEXT416(0x40000000));
  auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar7);
  uVar2 = vcmpss_avx512f(auVar7,auVar14,1);
  SampledSpectrum::SampledSpectrum(&local_40,(Float)((uint)!(bool)((byte)uVar2 & 1) * auVar6._0_4_))
  ;
  return (array<float,_4>)(array<float,_4>)local_40;
}

Assistant:

Density(const Point3f &p, const SampledWavelengths &lambda) const {
        Point3f pp = 5 * extent * p;

        // Use noise to perturb the lookup point.
        if (wispiness > 0) {
            Float vscale = .05f * wispiness, vlac = 10.f;
            for (int i = 0; i < 2; ++i) {
                Float delta = .01f;
                // TODO: update Noise() to return the gradient?
                Float base = Noise(vlac * pp);
                Point3f pd(Noise(vlac * pp + Vector3f(delta, 0, 0)),
                           Noise(vlac * pp + Vector3f(0, delta, 0)),
                           Noise(vlac * pp + Vector3f(0, 0, delta)));
                pp += vscale * (pd - Vector3f(base, base, base)) / delta;
                vscale *= 0.5f;
                vlac *= 2.01f;
            }
        }

        Float d = 0;
        Float scale = .5, lac = 1.f;
        for (int i = 0; i < 5; ++i) {
            d += scale * Noise(lac * pp);
            scale *= 0.5f;
            lac *= 2.01f;
        }

        d = Clamp((1 - p.y) * 4.5f * density * d, 0, 1);
        d += 2 * std::max<Float>(0, .5f - p.y);
        return SampledSpectrum(Clamp(d, 0, 1));
    }